

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::ObjectToNativeArray<Js::JavascriptNativeIntArray>
               (JavascriptNativeIntArray *arrayObject,JsNativeValueType valueType,UINT length,
               UINT elementSize,byte *buffer,ScriptContext *scriptContext)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  uint16 uVar4;
  uint uVar5;
  uint32 uVar6;
  int iVar7;
  charcount_t cVar8;
  ulong uVar9;
  unsigned_long uVar10;
  long lVar11;
  Var pvVar12;
  JavascriptString *this;
  undefined4 extraout_var;
  undefined4 *puVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  
  if ((int)((ulong)length * (ulong)elementSize >> 0x20) != 0) {
    ::Math::DefaultOverflowPolicy();
  }
  if (valueType < (JsNativeStringType|JsUint8Type)) {
    uVar9 = (ulong)length * (ulong)elementSize & 0xffffffff;
    switch(valueType) {
    case JsInt8Type:
      if (elementSize != 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2904,"(elementSize == sizeof(int8))",
                                    "elementSize == sizeof(int8)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 <= uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2908,"((i + 1) * sizeof(int8) <= allocSize)",
                                        "(i + 1) * sizeof(int8) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar5 = JavascriptConversion::ToInt32_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar5;
          }
          buffer[uVar14] = (byte)pvVar12;
          uVar14 = uVar14 + 1;
        } while (length != uVar14);
      }
      break;
    case JsUint8Type:
      if (elementSize != 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x290e,"(elementSize == sizeof(uint8))",
                                    "elementSize == sizeof(uint8)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 <= uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2912,"((i + 1) * sizeof(uint8) <= allocSize)",
                                        "(i + 1) * sizeof(uint8) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar6 = JavascriptConversion::ToUInt32_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar6;
          }
          buffer[uVar14] = (byte)pvVar12;
          uVar14 = uVar14 + 1;
        } while (length != uVar14);
      }
      break;
    case JsInt16Type:
      if (elementSize != 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2917,"(elementSize == sizeof(int16))",
                                    "elementSize == sizeof(int16)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 2;
        uVar15 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar15,scriptContext);
          if (uVar9 < uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x291b,"((i + 1) * sizeof(int16) <= allocSize)",
                                        "(i + 1) * sizeof(int16) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar6 = JavascriptConversion::ToUInt32_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar6;
          }
          *(short *)(buffer + uVar15 * 2) = (short)pvVar12;
          uVar15 = uVar15 + 1;
          uVar14 = uVar14 + 2;
        } while (length != uVar15);
      }
      break;
    case JsUint16Type:
      if (elementSize != 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2920,"(elementSize == sizeof(uint16))",
                                    "elementSize == sizeof(uint16)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 2;
        uVar15 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar15,scriptContext);
          if (uVar9 < uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2924,"((i + 1) * sizeof(uint16) <= allocSize)",
                                        "(i + 1) * sizeof(uint16) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar4 = JavascriptConversion::ToUInt16_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar4;
          }
          *(short *)(buffer + uVar15 * 2) = (short)pvVar12;
          uVar15 = uVar15 + 1;
          uVar14 = uVar14 + 2;
        } while (length != uVar15);
      }
      break;
    case JsInt32Type:
      if (elementSize != 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2929,"(elementSize == sizeof(int32))",
                                    "elementSize == sizeof(int32)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 4;
        uVar15 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar15,scriptContext);
          if (uVar9 < uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x292d,"((i + 1) * sizeof(int32) <= allocSize)",
                                        "(i + 1) * sizeof(int32) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar5 = JavascriptConversion::ToInt32_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar5;
          }
          *(int *)(buffer + uVar15 * 4) = (int)pvVar12;
          uVar15 = uVar15 + 1;
          uVar14 = uVar14 + 4;
        } while (length != uVar15);
      }
      break;
    case JsUint32Type:
      if (elementSize != 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2932,"(elementSize == sizeof(uint32))",
                                    "elementSize == sizeof(uint32)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar14 = 4;
        uVar15 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar15,scriptContext);
          if (uVar9 < uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2936,"((i + 1) * sizeof(uint32) <= allocSize)",
                                        "(i + 1) * sizeof(uint32) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar13 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar3) goto LAB_00add64a;
              *puVar13 = 0;
            }
          }
          else {
            uVar6 = JavascriptConversion::ToUInt32_Full(pvVar12,scriptContext);
            pvVar12 = (Var)(ulong)uVar6;
          }
          *(int *)(buffer + uVar15 * 4) = (int)pvVar12;
          uVar15 = uVar15 + 1;
          uVar14 = uVar14 + 4;
        } while (length != uVar15);
      }
      break;
    case JsInt64Type:
      if (elementSize != 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x293b,"(elementSize == sizeof(int64))",
                                    "elementSize == sizeof(int64)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar15 = 8;
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 < uVar15) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x293f,"((i + 1) * sizeof(int64) <= allocSize)",
                                        "(i + 1) * sizeof(int64) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          uVar1 = uVar14 + 1;
          lVar11 = JavascriptConversion::ToInt64(pvVar12,scriptContext);
          *(long *)(buffer + uVar14 * 8) = lVar11;
          uVar15 = uVar15 + 8;
          uVar14 = uVar1;
        } while (length != uVar1);
      }
      break;
    case JsUint64Type:
      if (elementSize != 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2944,"(elementSize == sizeof(uint64))",
                                    "elementSize == sizeof(uint64)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar15 = 8;
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 < uVar15) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2948,"((i + 1) * sizeof(uint64) <= allocSize)",
                                        "(i + 1) * sizeof(uint64) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          uVar1 = uVar14 + 1;
          uVar10 = JavascriptConversion::ToUInt64(pvVar12,scriptContext);
          *(unsigned_long *)(buffer + uVar14 * 8) = uVar10;
          uVar15 = uVar15 + 8;
          uVar14 = uVar1;
        } while (length != uVar1);
      }
      break;
    case JsFloatType:
      if (elementSize != 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x294d,"(elementSize == sizeof(float))",
                                    "elementSize == sizeof(float)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar15 = 4;
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 < uVar15) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2951,"((i + 1) * sizeof(float) <= allocSize)",
                                        "(i + 1) * sizeof(float) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            dVar16 = (double)(int)pvVar12;
          }
          else if (pvVar12 < (Var)0x4000000000000) {
            dVar16 = JavascriptConversion::ToNumber_Full(pvVar12,scriptContext);
          }
          else {
            dVar16 = (double)((ulong)pvVar12 ^ 0xfffc000000000000);
          }
          *(float *)(buffer + uVar14 * 4) = (float)dVar16;
          uVar14 = uVar14 + 1;
          uVar15 = uVar15 + 4;
        } while (length != uVar14);
      }
      break;
    case JsDoubleType:
      if (elementSize != 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2956,"(elementSize == sizeof(double))",
                                    "elementSize == sizeof(double)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar15 = 8;
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 < uVar15) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x295a,"((i + 1) * sizeof(double) <= allocSize)",
                                        "(i + 1) * sizeof(double) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          if (((ulong)pvVar12 & 0xffff000000000000) == 0x1000000000000) {
            dVar16 = (double)(int)pvVar12;
          }
          else if (pvVar12 < (Var)0x4000000000000) {
            dVar16 = JavascriptConversion::ToNumber_Full(pvVar12,scriptContext);
          }
          else {
            dVar16 = (double)((ulong)pvVar12 ^ 0xfffc000000000000);
          }
          *(double *)(buffer + uVar14 * 8) = dVar16;
          uVar14 = uVar14 + 1;
          uVar15 = uVar15 + 8;
        } while (length != uVar14);
      }
      break;
    case JsNativeStringType:
      if (elementSize != 0x10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x295f,"(elementSize == sizeof(JsNativeString))",
                                    "elementSize == sizeof(JsNativeString)");
        if (!bVar3) goto LAB_00add64a;
        *puVar13 = 0;
      }
      if (length != 0) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        uVar15 = 0x10;
        uVar14 = 0;
        do {
          pvVar12 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                              (arrayObject,(UINT)uVar14,scriptContext);
          if (uVar9 < uVar15) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x2963,"((i + 1) * sizeof(JsNativeString) <= allocSize)",
                                        "(i + 1) * sizeof(JsNativeString) <= allocSize");
            if (!bVar3) goto LAB_00add64a;
            *puVar13 = 0;
          }
          uVar14 = uVar14 + 1;
          this = JavascriptConversion::ToString(pvVar12,scriptContext);
          iVar7 = (*(this->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this);
          *(ulong *)(buffer + (uVar15 - 8)) = CONCAT44(extraout_var,iVar7);
          cVar8 = JavascriptString::GetLength(this);
          *(charcount_t *)(buffer + (uVar15 - 0x10)) = cVar8;
          uVar15 = uVar15 + 0x10;
        } while (length != uVar14);
      }
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x296a,"(0)","FALSE");
    if (!bVar3) {
LAB_00add64a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar13 = 0;
  }
  return;
}

Assistant:

void JavascriptOperators::ObjectToNativeArray(T* arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Var element;
        uint64 allocSize = UInt32Math::Mul(length, elementSize);

        // TODO:further fast path the call for things like IntArray convert to int, floatarray convert to float etc.
        // such that we don't need boxing.
        switch (valueType)
        {
        case JsInt8Type:
            AnalysisAssert(elementSize == sizeof(int8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int8) <= allocSize);
#pragma prefast(suppress:22102)
                ((int8*)buffer)[i] = Js::JavascriptConversion::ToInt8(element, scriptContext);
            }
            break;
        case JsUint8Type:
            AnalysisAssert(elementSize == sizeof(uint8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint8) <= allocSize);
                ((uint8*)buffer)[i] = Js::JavascriptConversion::ToUInt8(element, scriptContext);
            }
            break;
        case JsInt16Type:
            AnalysisAssert(elementSize == sizeof(int16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int16) <= allocSize);
                ((int16*)buffer)[i] = Js::JavascriptConversion::ToInt16(element, scriptContext);
            }
            break;
        case JsUint16Type:
            AnalysisAssert(elementSize == sizeof(uint16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint16) <= allocSize);
                ((uint16*)buffer)[i] = Js::JavascriptConversion::ToUInt16(element, scriptContext);
            }
            break;
        case JsInt32Type:
            AnalysisAssert(elementSize == sizeof(int32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int32) <= allocSize);
                ((int32*)buffer)[i] = Js::JavascriptConversion::ToInt32(element, scriptContext);
            }
            break;
        case JsUint32Type:
            AnalysisAssert(elementSize == sizeof(uint32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint32) <= allocSize);
                ((uint32*)buffer)[i] = Js::JavascriptConversion::ToUInt32(element, scriptContext);
            }
            break;
        case JsInt64Type:
            AnalysisAssert(elementSize == sizeof(int64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int64) <= allocSize);
                ((int64*)buffer)[i] = Js::JavascriptConversion::ToInt64(element, scriptContext);
            }
            break;
        case JsUint64Type:
            AnalysisAssert(elementSize == sizeof(uint64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint64) <= allocSize);
                ((uint64*)buffer)[i] = Js::JavascriptConversion::ToUInt64(element, scriptContext);
            }
            break;
        case JsFloatType:
            AnalysisAssert(elementSize == sizeof(float));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(float) <= allocSize);
                ((float*)buffer)[i] = Js::JavascriptConversion::ToFloat(element, scriptContext);
            }
            break;
        case JsDoubleType:
            AnalysisAssert(elementSize == sizeof(double));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(double) <= allocSize);
                ((double*)buffer)[i] = Js::JavascriptConversion::ToNumber(element, scriptContext);
            }
            break;
        case JsNativeStringType:
            AnalysisAssert(elementSize == sizeof(JsNativeString));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(JsNativeString) <= allocSize);
                Js::JavascriptString* string = Js::JavascriptConversion::ToString(element, scriptContext);
                (((JsNativeString*)buffer)[i]).str = string->GetSz();
                (((JsNativeString*)buffer)[i]).length = string->GetLength();
            }
            break;
        default:
            Assert(FALSE);
        }
    }